

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O0

string * extractFileDir(string *__return_storage_ptr__,string *fileName)

{
  allocator<char> local_21;
  long local_20;
  size_t index;
  string *fileName_local;
  
  index = (size_t)fileName;
  fileName_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char)fileName,0x2f);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,index);
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileDir(const string& fileName)
{
    size_t index = fileName.find_last_of('/');
    if (index != string::npos)
        return fileName.substr(0, index + 1);
    return "";
}